

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall
leveldb::log::LogTest::CheckOffsetPastEndReturnsNoRecords(LogTest *this,uint64_t offset_past_end)

{
  size_type sVar1;
  bool bVar2;
  Reader *this_00;
  Slice record;
  string scratch;
  Tester local_1c8;
  
  WriteInitialOffsetLog(this);
  this->reading_ = true;
  sVar1 = (this->dest_).contents_._M_string_length;
  (this->source_).contents_.data_ = (this->dest_).contents_._M_dataplus._M_p;
  (this->source_).contents_.size_ = sVar1;
  this_00 = (Reader *)operator_new(0x58);
  Reader::Reader(this_00,&(this->source_).super_SequentialFile,&(this->report_).super_Reporter,true,
                 offset_past_end + sVar1);
  record.data_ = "";
  record.size_ = 0;
  scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
  scratch._M_string_length = 0;
  scratch.field_2._M_local_buf[0] = '\0';
  test::Tester::Tester
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x85);
  bVar2 = Reader::ReadRecord(this_00,&record,&scratch);
  test::Tester::Is(&local_1c8,!bVar2,"!offset_reader->ReadRecord(&record, &scratch)");
  test::Tester::~Tester(&local_1c8);
  Reader::~Reader(this_00);
  operator_delete(this_00);
  std::__cxx11::string::~string((string *)&scratch);
  return;
}

Assistant:

void CheckOffsetPastEndReturnsNoRecords(uint64_t offset_past_end) {
    WriteInitialOffsetLog();
    reading_ = true;
    source_.contents_ = Slice(dest_.contents_);
    Reader* offset_reader = new Reader(&source_, &report_, true /*checksum*/,
                                       WrittenBytes() + offset_past_end);
    Slice record;
    std::string scratch;
    ASSERT_TRUE(!offset_reader->ReadRecord(&record, &scratch));
    delete offset_reader;
  }